

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

string * __thiscall
amrex::ParmParse::PP_entry::print_abi_cxx11_(string *__return_storage_ptr__,PP_entry *this)

{
  pointer pbVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  stringstream t;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_name)._M_dataplus._M_p,(this->m_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  uVar3 = (long)(this->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)(uVar3 >> 5);
  if (0 < (int)uVar6) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pbVar1 = (this->m_vals).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,*(char **)((long)pbVar1 + lVar4 + -8),
                 *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      if ((long)uVar5 < (long)(uVar3 * 0x8000000 + -0x100000000) >> 0x20) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while ((uVar6 & 0x7fffffff) != uVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string
ParmParse::PP_entry::print () const {
    std::stringstream t;
    t << m_name << " = ";
    int n = m_vals.size();
    for ( int i = 0; i < n; i++)
    {
        t << m_vals[i];
        if ( i < n-1 ) t << " ";
    }
    return t.str();
}